

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartSharedAttributes.cpp
# Opt level: O1

void testMultiPartSharedAttributes(string *tempDir)

{
  int iVar1;
  pointer pcVar2;
  int width;
  pointer pHVar3;
  pointer pHVar4;
  _Alloc_hider fileName;
  int iVar5;
  int iVar6;
  uint uVar7;
  ChannelList *pCVar8;
  Box2i *pBVar9;
  string *psVar10;
  V2f *pVVar11;
  float *pfVar12;
  char *pcVar13;
  V2f VVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  undefined1 *type;
  ulong uVar18;
  float fVar19;
  vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> headers;
  Header header;
  size_type __dnew;
  vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> headers_1;
  TimeCodeAttribute tta;
  string fn;
  TimeCode t;
  TimeCodeAttribute ta;
  TimeCodeAttribute ta_1;
  TimeCode t_1;
  stringstream ss;
  vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> local_318;
  undefined1 local_2f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_2e8;
  V2f VStack_2d8;
  undefined1 local_2c0 [8];
  V2f local_2b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_2b0;
  V2f VStack_2a0;
  Chromaticities local_288;
  int local_25c;
  vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> local_258;
  string local_238;
  TimeCode local_218 [4];
  string local_1f8 [2];
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [7];
  ios_base local_138 [264];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing multi part APIs : shared attributes, header... ",0x37);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  random_reseed(1);
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  pcVar2 = (tempDir->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_238,pcVar2,pcVar2 + tempDir->_M_string_length);
  std::__cxx11::string::append((char *)&local_238);
  local_318.super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_318.super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>._M_impl.
  super__Vector_impl_data._M_start = (Header *)0x0;
  local_318.super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar16 = 0;
  do {
    local_1b8._0_4_ = 0.0;
    local_1b8._4_4_ = 0.0;
    Imf_2_5::Header::Header
              ((Header *)local_2f8,0xc5,0x107,1.0,(V2f *)local_1b8,1.0,INCREASING_Y,ZIP_COMPRESSION)
    ;
    iVar5 = random_int(3);
    iVar6 = random_int(2);
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::ostream::operator<<(local_1a8,iVar16);
    std::__cxx11::stringbuf::str();
    Imf_2_5::Header::setName((Header *)local_2f8,(string *)local_2c0);
    if (local_2c0 != (undefined1  [8])&aStack_2b0) {
      operator_delete((void *)local_2c0,aStack_2b0._M_allocated_capacity + 1);
    }
    if (iVar5 == 0) {
      pCVar8 = Imf_2_5::Header::channels((Header *)local_2f8);
      Imf_2_5::Channel::Channel((Channel *)local_2c0,UINT,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar8,"UINT",(Channel *)local_2c0);
    }
    else if (iVar5 == 1) {
      pCVar8 = Imf_2_5::Header::channels((Header *)local_2f8);
      Imf_2_5::Channel::Channel((Channel *)local_2c0,FLOAT,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar8,"FLOAT",(Channel *)local_2c0);
    }
    else if (iVar5 == 2) {
      pCVar8 = Imf_2_5::Header::channels((Header *)local_2f8);
      Imf_2_5::Channel::Channel((Channel *)local_2c0,HALF,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar8,"HALF",(Channel *)local_2c0);
    }
    type = Imf_2_5::SCANLINEIMAGE_abi_cxx11_;
    if (iVar6 == 0) {
LAB_00170cb6:
      Imf_2_5::Header::setType((Header *)local_2f8,(string *)type);
      if (iVar6 == 1) {
        iVar5 = random_int(0xc5);
        iVar6 = random_int(0x107);
        local_2b8.x = (float)random_int(3);
        if (2 < (uint)local_2b8.x) {
          local_2b8.x = 4.2039e-45;
        }
        local_2c0._4_4_ = iVar6 + 1;
        local_2c0._0_4_ = iVar5 + 1;
        local_2b8.y = 0.0;
        Imf_2_5::Header::setTileDescription((Header *)local_2f8,(TileDescription *)local_2c0);
      }
    }
    else if (iVar6 == 1) {
      type = Imf_2_5::TILEDIMAGE_abi_cxx11_;
      goto LAB_00170cb6;
    }
    std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::push_back
              (&local_318,(Header *)local_2f8);
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
    Imf_2_5::Header::~Header((Header *)local_2f8);
    iVar16 = iVar16 + 1;
    if (iVar16 == 3) {
      remove(local_238._M_dataplus._M_p);
      fileName._M_p = local_238._M_dataplus._M_p;
      pHVar4 = local_318.super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      pHVar3 = local_318.super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>.
               _M_impl.super__Vector_impl_data._M_start;
      iVar16 = Imf_2_5::globalThreadCount();
      Imf_2_5::MultiPartOutputFile::MultiPartOutputFile
                ((MultiPartOutputFile *)local_1b8,fileName._M_p,pHVar3,
                 (int)((ulong)((long)pHVar4 - (long)pHVar3) >> 3) * -0x49249249,false,iVar16);
      Imf_2_5::MultiPartOutputFile::~MultiPartOutputFile((MultiPartOutputFile *)local_1b8);
      std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::vector
                ((vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *)&local_288,&local_318)
      ;
      pBVar9 = Imf_2_5::Header::displayWindow((Header *)local_288.red);
      iVar16 = (pBVar9->max).x;
      iVar5 = (pBVar9->min).x;
      iVar6 = (pBVar9->max).y;
      iVar1 = (pBVar9->min).y;
      iVar15 = (iVar6 - iVar1) + 10;
      width = (iVar16 - iVar5) + 10;
      if (iVar6 < iVar1 || iVar16 < iVar5) {
        iVar15 = 10;
        width = 10;
      }
      local_2f8._0_4_ = 0.0;
      local_2f8._4_4_ = 0.0;
      Imf_2_5::Header::Header
                ((Header *)local_1b8,width,iVar15,1.0,(V2f *)local_2f8,1.0,INCREASING_Y,
                 ZIP_COMPRESSION);
      psVar10 = Imf_2_5::Header::type_abi_cxx11_((Header *)local_288.red);
      Imf_2_5::Header::setType((Header *)local_1b8,psVar10);
      psVar10 = Imf_2_5::Header::name_abi_cxx11_((Header *)local_288.red);
      local_2c0 = (undefined1  [8])&aStack_2b0;
      aStack_2b0._M_allocated_capacity = 0x6461654877656e5f;
      local_2b8.x = 1.4013e-44;
      local_2b8.y = 0.0;
      aStack_2b0._8_3_ = 0x7265;
      pVVar11 = (V2f *)std::__cxx11::string::replace
                                 ((ulong)local_2c0,0,(char *)0x0,(ulong)(psVar10->_M_dataplus)._M_p)
      ;
      local_2f8._0_8_ = *pVVar11;
      VVar14 = (V2f)(pVVar11 + 2);
      if ((V2f)local_2f8._0_8_ == VVar14) {
        aStack_2e8._M_allocated_capacity = *(undefined8 *)VVar14;
        aStack_2e8._8_8_ = pVVar11[3];
        local_2f8._0_8_ = &aStack_2e8;
      }
      else {
        aStack_2e8._M_allocated_capacity = *(undefined8 *)VVar14;
      }
      local_2f8._8_8_ = pVVar11[1];
      *pVVar11 = VVar14;
      pVVar11[1].x = 0.0;
      pVVar11[1].y = 0.0;
      *(undefined1 *)&pVVar11[2].x = 0;
      Imf_2_5::Header::setName((Header *)local_1b8,(string *)local_2f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._0_8_ != &aStack_2e8) {
        operator_delete((void *)local_2f8._0_8_,(ulong)(aStack_2e8._M_allocated_capacity + 1));
      }
      if (local_2c0 != (undefined1  [8])&aStack_2b0) {
        operator_delete((void *)local_2c0,aStack_2b0._M_allocated_capacity + 1);
      }
      std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::push_back
                ((vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *)&local_288,
                 (value_type *)local_1b8);
      local_2c0._0_4_ = 8.40779e-44;
      local_2c0._4_4_ = 0.0;
      local_2f8._0_8_ = &aStack_2e8;
      local_2f8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_2f8,(ulong)local_2c0);
      aStack_2e8._M_allocated_capacity = (size_type)local_2c0;
      builtin_strncpy((char *)(local_2f8._0_8_ + 0x2c),"ail for ",8);
      builtin_strncpy((char *)(local_2f8._0_8_ + 0x34),"!=values",8);
      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)(local_2f8._0_8_ + 0x20))->_M_allocated_capacity = 0x756f6873203a2077;
      builtin_strncpy((char *)(local_2f8._0_8_ + 0x28),"ld fail ",8);
      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)(local_2f8._0_8_ + 0x10))->_M_allocated_capacity = 0x70736964203a2073;
      builtin_strncpy((char *)(local_2f8._0_8_ + 0x18),"layWindo",8);
      *(undefined8 *)local_2f8._0_8_ = 0x4120646572616853;
      builtin_strncpy((char *)(local_2f8._0_8_ + 8),"ttribute",8);
      local_2f8._8_8_ = local_2c0;
      *(char *)(local_2f8._0_8_ + (long)local_2c0) = '\0';
      anon_unknown.dwarf_1d5fae::testMultiPartOutputFileForExpectedFailure
                ((vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *)&local_288,&local_238,
                 (string *)local_2f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._0_8_ != &aStack_2e8) {
        operator_delete((void *)local_2f8._0_8_,(ulong)(aStack_2e8._M_allocated_capacity + 1));
      }
      Imf_2_5::Header::~Header((Header *)local_1b8);
      std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::~vector
                ((vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *)&local_288);
      std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::vector
                ((vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *)&local_288,&local_318)
      ;
      pBVar9 = Imf_2_5::Header::displayWindow((Header *)local_288.red);
      iVar5 = (pBVar9->max).x;
      iVar6 = (pBVar9->min).x;
      iVar16 = (iVar5 - iVar6) + 1;
      if ((pBVar9->max).y < (pBVar9->min).y) {
        iVar16 = 1;
      }
      if (iVar5 < iVar6) {
        iVar16 = 1;
      }
      pBVar9 = Imf_2_5::Header::displayWindow((Header *)local_288.red);
      local_25c = (pBVar9->max).x;
      iVar5 = (pBVar9->min).x;
      iVar6 = (pBVar9->min).y;
      iVar1 = (pBVar9->max).y;
      pfVar12 = Imf_2_5::Header::pixelAspectRatio((Header *)local_288.red);
      iVar15 = (iVar1 - iVar6) + 1;
      if (iVar1 < iVar6) {
        iVar15 = 1;
      }
      if (local_25c < iVar5) {
        iVar15 = 1;
      }
      local_2f8._0_4_ = 0.0;
      local_2f8._4_4_ = 0.0;
      Imf_2_5::Header::Header
                ((Header *)local_1b8,iVar16,iVar15,*pfVar12 + 1.0,(V2f *)local_2f8,1.0,INCREASING_Y,
                 ZIP_COMPRESSION);
      psVar10 = Imf_2_5::Header::type_abi_cxx11_((Header *)local_288.red);
      Imf_2_5::Header::setType((Header *)local_1b8,psVar10);
      psVar10 = Imf_2_5::Header::name_abi_cxx11_((Header *)local_288.red);
      local_2c0 = (undefined1  [8])&aStack_2b0;
      aStack_2b0._M_allocated_capacity = 0x6461654877656e5f;
      local_2b8.x = 1.4013e-44;
      local_2b8.y = 0.0;
      aStack_2b0._8_3_ = 0x7265;
      pVVar11 = (V2f *)std::__cxx11::string::replace
                                 ((ulong)local_2c0,0,(char *)0x0,(ulong)(psVar10->_M_dataplus)._M_p)
      ;
      local_2f8._0_8_ = *pVVar11;
      VVar14 = (V2f)(pVVar11 + 2);
      if ((V2f)local_2f8._0_8_ == VVar14) {
        aStack_2e8._M_allocated_capacity = *(undefined8 *)VVar14;
        aStack_2e8._8_8_ = pVVar11[3];
        local_2f8._0_8_ = &aStack_2e8;
      }
      else {
        aStack_2e8._M_allocated_capacity = *(undefined8 *)VVar14;
      }
      local_2f8._8_8_ = pVVar11[1];
      *pVVar11 = VVar14;
      pVVar11[1].x = 0.0;
      pVVar11[1].y = 0.0;
      *(undefined1 *)&pVVar11[2].x = 0;
      Imf_2_5::Header::setName((Header *)local_1b8,(string *)local_2f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._0_8_ != &aStack_2e8) {
        operator_delete((void *)local_2f8._0_8_,(ulong)(aStack_2e8._M_allocated_capacity + 1));
      }
      if (local_2c0 != (undefined1  [8])&aStack_2b0) {
        operator_delete((void *)local_2c0,aStack_2b0._M_allocated_capacity + 1);
      }
      std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::push_back
                ((vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *)&local_288,
                 (value_type *)local_1b8);
      local_2c0._0_4_ = 8.68805e-44;
      local_2c0._4_4_ = 0.0;
      local_2f8._0_8_ = &aStack_2e8;
      local_2f8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_2f8,(ulong)local_2c0);
      aStack_2e8._M_allocated_capacity = (size_type)local_2c0;
      builtin_strncpy((char *)(local_2f8._0_8_ + 0x2e),"ail for ",8);
      builtin_strncpy((char *)(local_2f8._0_8_ + 0x36),"!=values",8);
      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)(local_2f8._0_8_ + 0x20))->_M_allocated_capacity = 0x6873203a206f6974;
      builtin_strncpy((char *)(local_2f8._0_8_ + 0x28),"ould fai",8);
      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)(local_2f8._0_8_ + 0x10))->_M_allocated_capacity = 0x65786970203a2073;
      builtin_strncpy((char *)(local_2f8._0_8_ + 0x18),"lAspecRa",8);
      *(undefined8 *)local_2f8._0_8_ = 0x4120646572616853;
      builtin_strncpy((char *)(local_2f8._0_8_ + 8),"ttribute",8);
      local_2f8._8_8_ = local_2c0;
      *(char *)(local_2f8._0_8_ + (long)local_2c0) = '\0';
      anon_unknown.dwarf_1d5fae::testMultiPartOutputFileForExpectedFailure
                ((vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *)&local_288,&local_238,
                 (string *)local_2f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._0_8_ != &aStack_2e8) {
        operator_delete((void *)local_2f8._0_8_,(ulong)(aStack_2e8._M_allocated_capacity + 1));
      }
      Imf_2_5::Header::~Header((Header *)local_1b8);
      std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::~vector
                ((vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *)&local_288);
      std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::vector
                ((vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *)&local_288,&local_318)
      ;
      Imf_2_5::Header::Header((Header *)local_1b8,(Header *)local_288.red);
      psVar10 = Imf_2_5::Header::name_abi_cxx11_((Header *)local_288.red);
      local_2c0 = (undefined1  [8])&aStack_2b0;
      aStack_2b0._M_allocated_capacity = 0x6461654877656e5f;
      local_2b8.x = 1.4013e-44;
      local_2b8.y = 0.0;
      aStack_2b0._8_3_ = 0x7265;
      pVVar11 = (V2f *)std::__cxx11::string::replace
                                 ((ulong)local_2c0,0,(char *)0x0,(ulong)(psVar10->_M_dataplus)._M_p)
      ;
      local_2f8._0_8_ = *pVVar11;
      VVar14 = (V2f)(pVVar11 + 2);
      if ((V2f)local_2f8._0_8_ == VVar14) {
        aStack_2e8._M_allocated_capacity = *(undefined8 *)VVar14;
        aStack_2e8._8_8_ = pVVar11[3];
        local_2f8._0_8_ = &aStack_2e8;
      }
      else {
        aStack_2e8._M_allocated_capacity = *(undefined8 *)VVar14;
      }
      local_2f8._8_8_ = pVVar11[1];
      *pVVar11 = VVar14;
      pVVar11[1].x = 0.0;
      pVVar11[1].y = 0.0;
      *(undefined1 *)&pVVar11[2].x = 0;
      Imf_2_5::Header::setName((Header *)local_1b8,(string *)local_2f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._0_8_ != &aStack_2e8) {
        operator_delete((void *)local_2f8._0_8_,(ulong)(aStack_2e8._M_allocated_capacity + 1));
      }
      if (local_2c0 != (undefined1  [8])&aStack_2b0) {
        operator_delete((void *)local_2c0,aStack_2b0._M_allocated_capacity + 1);
      }
      Imf_2_5::TimeCode::TimeCode(local_218,0x12d687,0,TV60_PACKING);
      Imf_2_5::TypedAttribute<Imf_2_5::TimeCode>::TypedAttribute
                ((TypedAttribute<Imf_2_5::TimeCode> *)local_1f8,local_218);
      pcVar13 = Imf_2_5::TypedAttribute<Imf_2_5::TimeCode>::staticTypeName();
      Imf_2_5::Header::insert((Header *)local_1b8,pcVar13,(Attribute *)local_1f8);
      std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::push_back
                ((vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *)&local_288,
                 (value_type *)local_1b8);
      local_2c0._0_4_ = 7.84727e-44;
      local_2c0._4_4_ = 0.0;
      local_2f8._0_8_ = &aStack_2e8;
      local_2f8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_2f8,(ulong)local_2c0);
      aStack_2e8._M_allocated_capacity = (size_type)local_2c0;
      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)(local_2f8._0_8_ + 0x20))->_M_allocated_capacity = 0x616620646c756f68;
      builtin_strncpy((char *)(local_2f8._0_8_ + 0x28),"il for !",8);
      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)(local_2f8._0_8_ + 0x10))->_M_allocated_capacity = 0x656d6974203a2073;
      builtin_strncpy((char *)(local_2f8._0_8_ + 0x18),"code : s",8);
      *(undefined8 *)local_2f8._0_8_ = 0x4120646572616853;
      builtin_strncpy((char *)(local_2f8._0_8_ + 8),"ttribute",8);
      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)(local_2f8._0_8_ + 0x30))->_M_allocated_capacity = 0x65636e6573657270;
      local_2f8._8_8_ = local_2c0;
      *(char *)(local_2f8._0_8_ + (long)local_2c0) = '\0';
      anon_unknown.dwarf_1d5fae::testMultiPartOutputFileForExpectedFailure
                ((vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *)&local_288,&local_238,
                 (string *)local_2f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._0_8_ != &aStack_2e8) {
        operator_delete((void *)local_2f8._0_8_,(ulong)(aStack_2e8._M_allocated_capacity + 1));
      }
      if (local_288.green != local_288.red) {
        lVar17 = 0;
        uVar18 = 0;
        do {
          VVar14 = local_288.red;
          pcVar13 = Imf_2_5::TypedAttribute<Imf_2_5::TimeCode>::staticTypeName();
          Imf_2_5::Header::insert((Header *)((long)VVar14 + lVar17),pcVar13,(Attribute *)local_1f8);
          uVar18 = uVar18 + 1;
          lVar17 = lVar17 + 0x38;
        } while (uVar18 < (ulong)(((long)local_288.green - (long)local_288.red >> 3) *
                                 0x6db6db6db6db6db7));
      }
      uVar7 = Imf_2_5::TimeCode::timeAndFlags(local_218,TV60_PACKING);
      Imf_2_5::TimeCode::setTimeAndFlags(local_218,uVar7 + 1,TV60_PACKING);
      Imf_2_5::TypedAttribute<Imf_2_5::TimeCode>::TypedAttribute
                ((TypedAttribute<Imf_2_5::TimeCode> *)&local_258,local_218);
      pcVar13 = Imf_2_5::TypedAttribute<Imf_2_5::TimeCode>::staticTypeName();
      Imf_2_5::Header::insert((Header *)local_1b8,pcVar13,(Attribute *)&local_258);
      psVar10 = Imf_2_5::Header::name_abi_cxx11_((Header *)local_1b8);
      local_2c0 = (undefined1  [8])&aStack_2b0;
      aStack_2b0._M_allocated_capacity._0_4_ = 0x312b5f;
      local_2b8.x = 4.2039e-45;
      local_2b8.y = 0.0;
      pVVar11 = (V2f *)std::__cxx11::string::replace
                                 ((ulong)local_2c0,0,(char *)0x0,(ulong)(psVar10->_M_dataplus)._M_p)
      ;
      local_2f8._0_8_ = *pVVar11;
      VVar14 = (V2f)(pVVar11 + 2);
      if ((V2f)local_2f8._0_8_ == VVar14) {
        aStack_2e8._M_allocated_capacity = *(undefined8 *)VVar14;
        aStack_2e8._8_8_ = pVVar11[3];
        local_2f8._0_8_ = &aStack_2e8;
      }
      else {
        aStack_2e8._M_allocated_capacity = *(undefined8 *)VVar14;
      }
      local_2f8._8_8_ = pVVar11[1];
      *pVVar11 = VVar14;
      pVVar11[1].x = 0.0;
      pVVar11[1].y = 0.0;
      *(undefined1 *)&pVVar11[2].x = 0;
      Imf_2_5::Header::setName((Header *)local_1b8,(string *)local_2f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._0_8_ != &aStack_2e8) {
        operator_delete((void *)local_2f8._0_8_,(ulong)(aStack_2e8._M_allocated_capacity + 1));
      }
      if (local_2c0 != (undefined1  [8])&aStack_2b0) {
        operator_delete((void *)local_2c0,aStack_2b0._M_allocated_capacity + 1);
      }
      std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::push_back
                ((vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *)&local_288,
                 (value_type *)local_1b8);
      local_2c0._0_4_ = 7.84727e-44;
      local_2c0._4_4_ = 0.0;
      local_2f8._0_8_ = &aStack_2e8;
      local_2f8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_2f8,(ulong)local_2c0);
      aStack_2e8._M_allocated_capacity = (size_type)local_2c0;
      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)(local_2f8._0_8_ + 0x20))->_M_allocated_capacity = 0x616620646c756f68;
      builtin_strncpy((char *)(local_2f8._0_8_ + 0x28),"il for !",8);
      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)(local_2f8._0_8_ + 0x10))->_M_allocated_capacity = 0x656d6974203a2073;
      builtin_strncpy((char *)(local_2f8._0_8_ + 0x18),"code : s",8);
      *(undefined8 *)local_2f8._0_8_ = 0x4120646572616853;
      builtin_strncpy((char *)(local_2f8._0_8_ + 8),"ttribute",8);
      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)(local_2f8._0_8_ + 0x30))->_M_allocated_capacity = 0x7365756c6176203d;
      local_2f8._8_8_ = local_2c0;
      *(char *)(local_2f8._0_8_ + (long)local_2c0) = '\0';
      anon_unknown.dwarf_1d5fae::testMultiPartOutputFileForExpectedFailure
                ((vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *)&local_288,&local_238,
                 (string *)local_2f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._0_8_ != &aStack_2e8) {
        operator_delete((void *)local_2f8._0_8_,(ulong)(aStack_2e8._M_allocated_capacity + 1));
      }
      Imf_2_5::Attribute::~Attribute((Attribute *)&local_258);
      Imf_2_5::Attribute::~Attribute((Attribute *)local_1f8);
      Imf_2_5::Header::~Header((Header *)local_1b8);
      std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::~vector
                ((vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *)&local_288);
      std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::vector(&local_258,&local_318);
      Imf_2_5::Header::Header
                ((Header *)local_1b8,
                 local_258.super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      psVar10 = Imf_2_5::Header::name_abi_cxx11_
                          (local_258.
                           super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>.
                           _M_impl.super__Vector_impl_data._M_start);
      local_2c0 = (undefined1  [8])&aStack_2b0;
      aStack_2b0._M_allocated_capacity = 0x6461654877656e5f;
      local_2b8.x = 1.4013e-44;
      local_2b8.y = 0.0;
      aStack_2b0._8_3_ = 0x7265;
      pVVar11 = (V2f *)std::__cxx11::string::replace
                                 ((ulong)local_2c0,0,(char *)0x0,(ulong)(psVar10->_M_dataplus)._M_p)
      ;
      local_2f8._0_8_ = *pVVar11;
      VVar14 = (V2f)(pVVar11 + 2);
      if ((V2f)local_2f8._0_8_ == VVar14) {
        aStack_2e8._M_allocated_capacity = *(undefined8 *)VVar14;
        aStack_2e8._8_8_ = pVVar11[3];
        local_2f8._0_8_ = &aStack_2e8;
      }
      else {
        aStack_2e8._M_allocated_capacity = *(undefined8 *)VVar14;
      }
      local_2f8._8_8_ = pVVar11[1];
      *pVVar11 = VVar14;
      pVVar11[1].x = 0.0;
      pVVar11[1].y = 0.0;
      *(undefined1 *)&pVVar11[2].x = 0;
      Imf_2_5::Header::setName((Header *)local_1b8,(string *)local_2f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._0_8_ != &aStack_2e8) {
        operator_delete((void *)local_2f8._0_8_,(ulong)(aStack_2e8._M_allocated_capacity + 1));
      }
      if (local_2c0 != (undefined1  [8])&aStack_2b0) {
        operator_delete((void *)local_2c0,aStack_2b0._M_allocated_capacity + 1);
      }
      local_2f8._0_4_ = 0.64;
      local_2f8._4_4_ = 0.33;
      local_2c0._0_4_ = 0.3;
      local_2c0._4_4_ = 0.6;
      local_1f8[0]._M_dataplus._M_p = (pointer)0x3d75c28f3e19999a;
      local_218[0]._time = 0x3ea01a37;
      local_218[0]._user = 0x3ea872b0;
      Imf_2_5::Chromaticities::Chromaticities
                (&local_288,(V2f *)local_2f8,(V2f *)local_2c0,(V2f *)local_1f8,(V2f *)local_218);
      Imf_2_5::Attribute::Attribute((Attribute *)local_2f8);
      local_2f8._0_8_ = &PTR__Attribute_0043ad10;
      local_2f8._8_4_ = local_288.red.x;
      local_2f8._12_4_ = local_288.red.y;
      aStack_2e8._M_allocated_capacity._0_4_ = local_288.green.x;
      aStack_2e8._M_allocated_capacity._4_4_ = local_288.green.y;
      aStack_2e8._8_4_ = local_288.blue.x;
      aStack_2e8._12_4_ = local_288.blue.y;
      VStack_2d8 = local_288.white;
      pcVar13 = Imf_2_5::TypedAttribute<Imf_2_5::Chromaticities>::staticTypeName();
      Imf_2_5::Header::insert((Header *)local_1b8,pcVar13,(Attribute *)local_2f8);
      std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::push_back
                (&local_258,(value_type *)local_1b8);
      local_2c0 = (undefined1  [8])&aStack_2b0;
      local_1f8[0]._M_dataplus._M_p = (pointer)0x3d;
      local_2c0 = (undefined1  [8])
                  std::__cxx11::string::_M_create((ulong *)local_2c0,(ulong)local_1f8);
      aStack_2b0._M_allocated_capacity = (size_type)local_1f8[0]._M_dataplus._M_p;
      builtin_strncpy((char *)((long)local_2c0 + 0x2d),"ail for ",8);
      builtin_strncpy((char *)((long)local_2c0 + 0x35),"!present",8);
      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)((long)local_2c0 + 0x20))->_M_allocated_capacity = 0x6f6873203a207365;
      builtin_strncpy((char *)((long)local_2c0 + 0x28),"uld fail",8);
      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)((long)local_2c0 + 0x10))->_M_allocated_capacity = 0x6f726863203a2073;
      builtin_strncpy((char *)((long)local_2c0 + 0x18),"maticiti",8);
      *(undefined8 *)local_2c0 = 0x4120646572616853;
      builtin_strncpy((char *)((long)local_2c0 + 8),"ttribute",8);
      local_2b8 = (V2f)local_1f8[0]._M_dataplus._M_p;
      local_1f8[0]._M_dataplus._M_p[(long)local_2c0] = '\0';
      anon_unknown.dwarf_1d5fae::testMultiPartOutputFileForExpectedFailure
                (&local_258,&local_238,(string *)local_2c0);
      if (local_2c0 != (undefined1  [8])&aStack_2b0) {
        operator_delete((void *)local_2c0,aStack_2b0._M_allocated_capacity + 1);
      }
      if (local_258.super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_258.super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>._M_impl.
          super__Vector_impl_data._M_start) {
        lVar17 = 0;
        uVar18 = 0;
        do {
          pHVar3 = local_258.super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pcVar13 = Imf_2_5::TypedAttribute<Imf_2_5::Chromaticities>::staticTypeName();
          Imf_2_5::Header::insert((Header *)((long)pHVar3 + lVar17),pcVar13,(Attribute *)local_2f8);
          uVar18 = uVar18 + 1;
          lVar17 = lVar17 + 0x38;
        } while (uVar18 < (ulong)(((long)local_258.
                                         super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_258.
                                         super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                 0x6db6db6db6db6db7));
      }
      fVar19 = local_288.red.x;
      local_288.red.y = local_288.red.y + 1.0;
      local_288.red.x = fVar19 + 1.0;
      Imf_2_5::Attribute::Attribute((Attribute *)local_2c0);
      local_2c0 = (undefined1  [8])&PTR__Attribute_0043ad10;
      local_2b8 = local_288.red;
      aStack_2b0._M_allocated_capacity._0_4_ = local_288.green.x;
      aStack_2b0._M_allocated_capacity._4_4_ = local_288.green.y;
      aStack_2b0._8_4_ = local_288.blue.x;
      aStack_2b0._12_4_ = local_288.blue.y;
      VStack_2a0 = local_288.white;
      pcVar13 = Imf_2_5::TypedAttribute<Imf_2_5::Chromaticities>::staticTypeName();
      Imf_2_5::Header::insert((Header *)local_1b8,pcVar13,(Attribute *)local_2c0);
      std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::push_back
                (&local_258,(value_type *)local_1b8);
      local_218[0]._time = 0x3e;
      local_218[0]._user = 0;
      local_1f8[0]._M_dataplus._M_p = (pointer)&local_1f8[0].field_2;
      local_1f8[0]._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)local_1f8,(ulong)local_218);
      local_1f8[0].field_2._0_4_ = local_218[0]._time;
      local_1f8[0].field_2._4_4_ = local_218[0]._user;
      builtin_strncpy(local_1f8[0]._M_dataplus._M_p,
                      "Shared Attributes : chromaticities : should fail for != values",0x3e);
      local_1f8[0]._M_string_length._0_4_ = local_218[0]._time;
      local_1f8[0]._M_string_length._4_4_ = local_218[0]._user;
      local_1f8[0]._M_dataplus._M_p[(long)local_218[0]] = '\0';
      anon_unknown.dwarf_1d5fae::testMultiPartOutputFileForExpectedFailure
                (&local_258,&local_238,local_1f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8[0]._M_dataplus._M_p != &local_1f8[0].field_2) {
        operator_delete(local_1f8[0]._M_dataplus._M_p,local_1f8[0].field_2._M_allocated_capacity + 1
                       );
      }
      Imf_2_5::Attribute::~Attribute((Attribute *)local_2c0);
      Imf_2_5::Attribute::~Attribute((Attribute *)local_2f8);
      Imf_2_5::Header::~Header((Header *)local_1b8);
      std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::~vector(&local_258);
      std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::~vector(&local_318);
      local_318.super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>._M_impl.
      super__Vector_impl_data._M_start = (Header *)0x0;
      local_318.super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_318.super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1b8._0_8_ = local_1a8;
      local_2f8._0_4_ = 4.62428e-44;
      local_2f8._4_4_ = 0.0;
      local_1b8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_1b8,(ulong)local_2f8);
      local_1a8[0]._M_allocated_capacity = local_2f8._0_8_;
      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)(local_1b8._0_8_ + 0x10))->_M_allocated_capacity = 0x696c207265646165;
      builtin_strncpy((char *)(local_1b8._0_8_ + 0x18),"st passe",8);
      *(undefined8 *)local_1b8._0_8_ = 0x3a20726564616548;
      builtin_strncpy((char *)(local_1b8._0_8_ + 8)," empty h",8);
      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)(local_1b8._0_8_ + 0x20))->_M_local_buf[0] = 'd';
      local_1b8._8_8_ = local_2f8._0_8_;
      *(char *)(local_1b8._0_8_ + local_2f8._0_8_) = '\0';
      anon_unknown.dwarf_1d5fae::testMultiPartOutputFileForExpectedFailure
                (&local_318,&local_238,(string *)local_1b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._0_8_ != local_1a8) {
        operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
      }
      local_1b8._0_4_ = 0.0;
      local_1b8._4_4_ = 0.0;
      Imf_2_5::Header::Header
                ((Header *)local_2f8,0x40,0x40,1.0,(V2f *)local_1b8,1.0,INCREASING_Y,ZIP_COMPRESSION
                );
      std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::push_back
                (&local_318,(value_type *)local_2f8);
      local_1b8._0_8_ = local_1a8;
      local_2c0._0_4_ = 4.48416e-44;
      local_2c0._4_4_ = 0.0;
      local_1b8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_1b8,(ulong)local_2c0);
      local_1a8[0]._M_allocated_capacity = local_2c0;
      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)(local_1b8._0_8_ + 0x10))->_M_allocated_capacity = 0x707974206567616d;
      builtin_strncpy((char *)(local_1b8._0_8_ + 0x18),"e passed",8);
      *(undefined8 *)local_1b8._0_8_ = 0x3a20726564616548;
      builtin_strncpy((char *)(local_1b8._0_8_ + 8)," empty i",8);
      local_1b8._8_8_ = local_2c0;
      *(char *)(local_1b8._0_8_ + (long)local_2c0) = '\0';
      anon_unknown.dwarf_1d5fae::testMultiPartOutputFileForExpectedFailure
                (&local_318,&local_238,(string *)local_1b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._0_8_ != local_1a8) {
        operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8[0]._M_allocated_capacity + 1));
      }
      Imf_2_5::Header::setType
                (local_318.super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 (string *)Imf_2_5::SCANLINEIMAGE_abi_cxx11_);
      Imf_2_5::Header::Header
                ((Header *)local_2c0,
                 local_318.super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::push_back
                (&local_318,(value_type *)local_2c0);
      local_1b8._0_8_ = local_1a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b8,"Header: duplicate header names passed","");
      anon_unknown.dwarf_1d5fae::testMultiPartOutputFileForExpectedFailure
                (&local_318,&local_238,(string *)local_1b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._0_8_ != local_1a8) {
        operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8[0]._M_allocated_capacity + 1));
      }
      pHVar3 = local_318.super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_1b8._0_8_ = local_1a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"invalid image type","");
      Imf_2_5::Header::setType(pHVar3,(string *)local_1b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._0_8_ != local_1a8) {
        operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8[0]._M_allocated_capacity + 1));
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Header : unsupported image type passed",0x26);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartSharedAttributes.cpp"
                    ,0x183,"void (anonymous namespace)::testHeaders(const std::string &)");
    }
  } while( true );
}

Assistant:

void
testMultiPartSharedAttributes (const std::string & tempDir)
{
    try
    {
        cout << "Testing multi part APIs : shared attributes, header... " << endl;

        random_reseed(1);

        std::string fn = tempDir +  "imf_test_multipart_shared_attrs.exr";

        testSharedAttributes (fn);
        testHeaders (fn);

        cout << " ... ok\n" << endl;
    }
    catch (const IEX_NAMESPACE::BaseExc & e)
    {
        cerr << "ERROR -- caught IEX_NAMESPACE::BaseExc exception: " << e.what() << endl;
        assert (false);
    }
    catch (const std::exception & e)
    {
        cerr << "ERROR -- caught std::exception exception: " << e.what() << endl;
        assert (false);
    }
}